

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-validator.cpp
# Opt level: O2

void __thiscall wasm::FunctionValidator::visitAtomicWait(FunctionValidator *this,AtomicWait *curr)

{
  Type left;
  Memory *pMVar1;
  Type right;
  
  pMVar1 = Module::getMemoryOrNull
                     ((this->
                      super_WalkerPass<wasm::PostWalker<wasm::FunctionValidator,_wasm::Visitor<wasm::FunctionValidator,_void>_>_>
                      ).
                      super_PostWalker<wasm::FunctionValidator,_wasm::Visitor<wasm::FunctionValidator,_void>_>
                      .
                      super_Walker<wasm::FunctionValidator,_wasm::Visitor<wasm::FunctionValidator,_void>_>
                      .currModule,(Name)(curr->memory).super_IString.str);
  shouldBeTrue<wasm::AtomicWait*>
            (this,pMVar1 != (Memory *)0x0,curr,"memory.atomicWait memory must exist");
  shouldBeTrue<wasm::AtomicWait*>
            (this,(bool)((byte)(((this->
                                 super_WalkerPass<wasm::PostWalker<wasm::FunctionValidator,_wasm::Visitor<wasm::FunctionValidator,_void>_>_>
                                 ).
                                 super_PostWalker<wasm::FunctionValidator,_wasm::Visitor<wasm::FunctionValidator,_void>_>
                                 .
                                 super_Walker<wasm::FunctionValidator,_wasm::Visitor<wasm::FunctionValidator,_void>_>
                                .currModule)->features).features & 1),curr,
             "Atomic operations require threads [--enable-threads]");
  shouldBeEqualOrFirstIsUnreachable<wasm::AtomicWait*,wasm::Type>
            (this,(Type)(curr->super_SpecificExpression<(wasm::Expression::Id)26>).super_Expression.
                        type.id,(Type)0x2,curr,"AtomicWait must have type i32");
  left.id = (curr->ptr->type).id;
  right = indexType(this,(Name)(curr->memory).super_IString.str);
  shouldBeEqualOrFirstIsUnreachable<wasm::AtomicWait*,wasm::Type>
            (this,left,right,curr,"AtomicWait pointer must match memory index type");
  shouldBeIntOrUnreachable
            (this,(Type)(curr->expected->type).id,(Expression *)curr,
             "AtomicWait expected type must be int");
  shouldBeEqualOrFirstIsUnreachable<wasm::AtomicWait*,wasm::Type>
            (this,(Type)(curr->expected->type).id,(Type)(curr->expectedType).id,curr,
             "AtomicWait expected type must match operand");
  shouldBeEqualOrFirstIsUnreachable<wasm::AtomicWait*,wasm::Type>
            (this,(Type)(curr->timeout->type).id,(Type)0x3,curr,
             "AtomicWait timeout type must be i64");
  return;
}

Assistant:

void FunctionValidator::visitAtomicWait(AtomicWait* curr) {
  auto* memory = getModule()->getMemoryOrNull(curr->memory);
  shouldBeTrue(!!memory, curr, "memory.atomicWait memory must exist");
  shouldBeTrue(getModule()->features.hasAtomics(),
               curr,
               "Atomic operations require threads [--enable-threads]");
  shouldBeEqualOrFirstIsUnreachable(
    curr->type, Type(Type::i32), curr, "AtomicWait must have type i32");
  shouldBeEqualOrFirstIsUnreachable(
    curr->ptr->type,
    indexType(curr->memory),
    curr,
    "AtomicWait pointer must match memory index type");
  shouldBeIntOrUnreachable(
    curr->expected->type, curr, "AtomicWait expected type must be int");
  shouldBeEqualOrFirstIsUnreachable(
    curr->expected->type,
    curr->expectedType,
    curr,
    "AtomicWait expected type must match operand");
  shouldBeEqualOrFirstIsUnreachable(curr->timeout->type,
                                    Type(Type::i64),
                                    curr,
                                    "AtomicWait timeout type must be i64");
}